

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int archive_read_open1(archive *_a)

{
  size_t *psVar1;
  code *pcVar2;
  undefined8 *puVar3;
  archive_read_filter *paVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long in_RAX;
  archive_read_filter *paVar10;
  size_t *psVar11;
  archive_read_filter *paVar12;
  char *pcVar13;
  archive_read_filter *self;
  uint uVar14;
  ulong uVar15;
  char **ppcVar16;
  uint uVar17;
  char **ppcVar18;
  long lVar19;
  long local_38;
  
  local_38 = in_RAX;
  iVar7 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_open");
  if (iVar7 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  if (_a[1].current_code == (char *)0x0) {
    archive_set_error(_a,0x16,"No reader function provided to archive_read_open");
    _a->state = 0x8000;
    return -0x1e;
  }
  pcVar2 = (code *)_a[1].error_string.buffer_length;
  if ((pcVar2 != (code *)0x0) &&
     (iVar7 = (*pcVar2)(_a,*(undefined8 *)(*(long *)&_a[2].compression_code + 0x10)), iVar7 != 0)) {
    lVar19._0_4_ = _a[2].magic;
    lVar19._4_4_ = _a[2].state;
    if (lVar19 == 0) {
      return iVar7;
    }
    if (_a[2].archive_format == 0) {
      return iVar7;
    }
    lVar19 = 0x10;
    uVar15 = 0;
    do {
      (**(code **)(_a + 2))(_a,*(undefined8 *)(*(long *)&_a[2].compression_code + lVar19));
      uVar15 = uVar15 + 1;
      lVar19 = lVar19 + 0x18;
    } while (uVar15 < (uint)_a[2].archive_format);
    return iVar7;
  }
  paVar10 = (archive_read_filter *)calloc(1,0xb0);
  if (paVar10 == (archive_read_filter *)0x0) {
    return -0x1e;
  }
  paVar10->archive = (archive_read *)_a;
  puVar3 = *(undefined8 **)&_a[2].compression_code;
  paVar10->data = (void *)puVar3[2];
  paVar10->open = client_open_proxy;
  paVar10->read = client_read_proxy;
  paVar10->skip = client_skip_proxy;
  paVar10->seek = client_seek_proxy;
  paVar10->close = client_close_proxy;
  paVar10->sswitch = client_switch_proxy;
  paVar10->name = "none";
  *puVar3 = 0;
  self = (archive_read_filter *)_a[8].compression_name;
  if ((self == (archive_read_filter *)0x0) || (paVar4 = self, _a[8].file_count == 0)) {
    _a[8].compression_name = (char *)paVar10;
    iVar9 = 0;
    ppcVar16 = (char **)0x0;
    iVar7 = 0;
    ppcVar18 = &_a[2].compression_name;
    do {
      do {
        if (((code *)ppcVar18[2] != (code *)0x0) &&
           (iVar8 = (*(code *)ppcVar18[2])(ppcVar18,_a[8].compression_name), iVar7 < iVar8)) {
          ppcVar16 = ppcVar18;
          iVar7 = iVar8;
        }
        iVar9 = iVar9 + 1;
        ppcVar18 = ppcVar18 + 6;
      } while (iVar9 != 0xe);
      if (ppcVar16 == (char **)0x0) {
        __archive_read_filter_ahead((archive_read_filter *)_a[8].compression_name,1,&local_38);
        if (local_38 < 0) {
          __archive_read_close_filters((archive_read *)_a);
          pcVar13 = _a[8].compression_name;
          while (pcVar13 != (char *)0x0) {
            pcVar5 = *(char **)(pcVar13 + 0x10);
            free(pcVar13);
            _a[8].compression_name = pcVar5;
            pcVar13 = pcVar5;
          }
          goto LAB_00106fe9;
        }
        self = (archive_read_filter *)_a[8].compression_name;
        _a->compression_name = self->name;
        _a->compression_code = self->code;
        goto LAB_00106ec1;
      }
      pcVar13 = (char *)calloc(1,0xb0);
      if (pcVar13 == (char *)0x0) goto LAB_00106fe9;
      *(char ***)(pcVar13 + 8) = ppcVar16;
      *(archive **)(pcVar13 + 0x18) = _a;
      *(char **)(pcVar13 + 0x10) = _a[8].compression_name;
      _a[8].compression_name = pcVar13;
      iVar8 = (*(code *)((archive_string *)(ppcVar16 + 3))->s)(pcVar13);
      iVar9 = 0;
      ppcVar16 = (char **)0x0;
      iVar7 = 0;
      ppcVar18 = &_a[2].compression_name;
    } while (iVar8 == 0);
    __archive_read_close_filters((archive_read *)_a);
    pcVar13 = _a[8].compression_name;
    while (pcVar13 != (char *)0x0) {
      pcVar5 = *(char **)(pcVar13 + 0x10);
      free(pcVar13);
      _a[8].compression_name = pcVar5;
      pcVar13 = pcVar5;
    }
  }
  else {
    do {
      paVar12 = paVar4;
      paVar4 = paVar12->upstream;
    } while (paVar4 != (archive_read_filter *)0x0);
    paVar12->upstream = paVar10;
LAB_00106ec1:
    if (_a[0x15].archive_format_name != (char *)0x0) {
LAB_00106ecb:
      _a->state = 2;
      client_switch_proxy(self,0);
      return 0;
    }
    psVar1 = &_a[8].error_string.length;
    _a[0x15].archive_format_name = (char *)psVar1;
    uVar17 = 0;
    uVar14 = 0xffffffff;
    iVar7 = -1;
    psVar11 = psVar1;
    do {
      if ((code *)psVar11[2] != (code *)0x0) {
        iVar9 = (*(code *)psVar11[2])(_a);
        if (iVar9 == -0x1e) goto LAB_00106fe1;
        if (((archive_read_filter *)_a[8].compression_name)->position != 0) {
          __archive_read_filter_seek((archive_read_filter *)_a[8].compression_name,0,0);
        }
        uVar6 = uVar17;
        if (-1 < (int)uVar14 && iVar9 <= iVar7) {
          uVar6 = uVar14;
          iVar9 = iVar7;
        }
        uVar14 = uVar6;
        psVar11 = (size_t *)_a[0x15].archive_format_name;
        iVar7 = iVar9;
      }
      uVar17 = uVar17 + 1;
      psVar11 = psVar11 + 0xb;
      _a[0x15].archive_format_name = (char *)psVar11;
    } while (uVar17 != 0x10);
    if ((int)uVar14 < 0) {
      pcVar13 = "No formats registered";
    }
    else {
      if (0 < iVar7) {
        _a[0x15].archive_format_name = (char *)(psVar1 + (ulong)uVar14 * 0xb);
        self = (archive_read_filter *)_a[8].compression_name;
        goto LAB_00106ecb;
      }
      pcVar13 = "Unrecognized archive format";
    }
    archive_set_error(_a,0x54,pcVar13);
LAB_00106fe1:
    __archive_read_close_filters((archive_read *)_a);
  }
LAB_00106fe9:
  _a->state = 0x8000;
  return -0x1e;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			if (a->client.closer) {
				for (i = 0; i < a->client.nodes; i++)
					(a->client.closer)(&a->archive,
					    a->client.dataset[i].data);
			}
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->open = client_open_proxy;
	filter->read = client_read_proxy;
	filter->skip = client_skip_proxy;
	filter->seek = client_seek_proxy;
	filter->close = client_close_proxy;
	filter->sswitch = client_switch_proxy;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			__archive_read_close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}